

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Args.cpp
# Opt level: O0

bool idx2::OptVal(int NArgs,cstr *Args,cstr Opt,array<int> *Vals)

{
  int iVar1;
  size_t sVar2;
  bool local_81;
  anon_union_8_2_2df48d06_for_stref_0 local_80;
  undefined4 local_78;
  int local_6c;
  int local_68;
  int X;
  int J;
  int I;
  array<int> *Vals_local;
  cstr Opt_local;
  cstr *Args_local;
  int NArgs_local;
  anon_union_8_2_2df48d06_for_stref_0 *local_38;
  array<int> *local_30;
  int *local_28;
  array<int> *local_20;
  long local_18;
  array<int> *local_10;
  
  Vals->Size = 0;
  X = 1;
  _J = Vals;
  Vals_local = (array<int> *)Opt;
  Opt_local = (cstr)Args;
  Args_local._0_4_ = NArgs;
  local_30 = Vals;
  while( true ) {
    if ((int)Args_local <= X) {
      return false;
    }
    iVar1 = strncmp(*(char **)(Opt_local + (long)X * 8),(char *)Vals_local,0x20);
    if (iVar1 == 0) break;
    X = X + 1;
  }
  local_68 = X;
  while( true ) {
    local_68 = local_68 + 1;
    local_81 = false;
    if (local_68 < (int)Args_local) {
      _NArgs_local = (anon_union_8_2_2df48d06_for_stref_0)
                     ((anon_union_8_2_2df48d06_for_stref_0 *)(Opt_local + (long)local_68 * 8))->Ptr;
      local_38 = &local_80;
      local_80 = _NArgs_local;
      sVar2 = strlen(_NArgs_local);
      local_78 = (undefined4)sVar2;
      local_81 = ToInt((stref *)&local_80,&local_6c);
    }
    if (local_81 == false) break;
    local_20 = _J;
    local_28 = &local_6c;
    if (_J->Capacity <= _J->Size) {
      GrowCapacity<int>(_J,0);
    }
    iVar1 = *local_28;
    local_10 = local_20;
    local_18 = local_20->Size;
    local_20->Size = local_18 + 1;
    *(int *)((local_20->Buffer).Data + local_18 * 4) = iVar1;
  }
  return X + 1 < local_68;
}

Assistant:

bool
OptVal(int NArgs, cstr* Args, cstr Opt, array<int>* Vals)
{
  Clear(Vals);
  for (int I = 1; I < NArgs; ++I)
  {
    if (strncmp(Args[I], Opt, 32) == 0)
    {
      int J = I;
      while (true)
      {
        ++J;
        int X;
        if (J < NArgs && ToInt(Args[J], &X))
          PushBack(Vals, X);
        else
          break;
      }
      return J > I + 1;
    }
  }

  return false;
}